

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_depspawn_sync.cpp
# Opt level: O3

void h(int *i,bool *test_ok)

{
  spin_mutex_t sVar1;
  long lVar2;
  ostream *poVar3;
  long *plVar4;
  Observer __depspawn_temporary72;
  Observer local_30;
  
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"h begin: ",9);
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - (long)t0.__d.__r) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," with i=",8);
  plVar4 = (long *)std::ostream::operator<<(poVar3,*i);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  *i = 0;
  depspawn::Observer::Observer(&local_30,true);
  depspawn::spawn<void(int&),int&>(g,i);
  depspawn::spawn<void(int&),int&>(g,i);
  depspawn::spawn<void(int&),int&>(f,i);
  depspawn::Observer::~Observer(&local_30);
  *test_ok = (bool)(*test_ok & *i == 0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x = ",4);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,x);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"h finish: ",10);
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - (long)t0.__d.__r) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," with i=",8);
  plVar4 = (long *)std::ostream::operator<<(poVar3,*i);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  return;
}

Assistant:

void h(int &i, bool& test_ok) {
  LOG("h begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
  
  i = 0;
  
  depspawn_sync(
    spawn(g, i); //Sets x to 1
    spawn(g, i); //Sets x to 2
    spawn(f, i); //Sets x to 12
  )
  
  test_ok = test_ok && (i == 12);
  std::cout << "x = " << x << std::endl;
  
  LOG("h finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
}